

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

void __thiscall
duckdb::CSVReaderOptions::ToNamedParameters
          (CSVReaderOptions *this,named_parameter_map_t *named_params)

{
  map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  *this_00;
  pointer pbVar1;
  mapped_type *pmVar2;
  long value;
  mapped_type *pmVar3;
  size_type sVar4;
  pointer pbVar5;
  Value local_1f0;
  allocator local_1a9;
  Value local_1a8;
  key_type local_168;
  vector<duckdb::Value,_true> content;
  vector<duckdb::Value,_true> local_128;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->dialect_options).state_machine_options.delimiter.set_by_user == true) {
    ::std::__cxx11::string::string
              ((string *)&local_50,
               (string *)&(this->dialect_options).state_machine_options.delimiter.value);
    Value::Value(&local_1a8,&local_50);
    ::std::__cxx11::string::string((string *)&local_1f0,"delim",(allocator *)&local_168);
    pmVar2 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)named_params,(key_type *)&local_1f0);
    Value::operator=(pmVar2,&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_1f0);
    Value::~Value(&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  if ((this->dialect_options).state_machine_options.new_line.set_by_user == true) {
    GetNewline_abi_cxx11_(&local_70,this);
    Value::Value(&local_1a8,&local_70);
    ::std::__cxx11::string::string((string *)&local_1f0,"new_line",(allocator *)&local_168);
    pmVar2 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)named_params,(key_type *)&local_1f0);
    Value::operator=(pmVar2,&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_1f0);
    Value::~Value(&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  if ((this->dialect_options).state_machine_options.quote.set_by_user == true) {
    GetQuote_abi_cxx11_(&local_90,this);
    Value::Value(&local_1a8,&local_90);
    ::std::__cxx11::string::string((string *)&local_1f0,"quote",(allocator *)&local_168);
    pmVar2 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)named_params,(key_type *)&local_1f0);
    Value::operator=(pmVar2,&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_1f0);
    Value::~Value(&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_90);
  }
  if ((this->dialect_options).state_machine_options.escape.set_by_user == true) {
    GetEscape_abi_cxx11_(&local_b0,this);
    Value::Value(&local_1a8,&local_b0);
    ::std::__cxx11::string::string((string *)&local_1f0,"escape",(allocator *)&local_168);
    pmVar2 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)named_params,(key_type *)&local_1f0);
    Value::operator=(pmVar2,&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_1f0);
    Value::~Value(&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_b0);
  }
  if ((this->dialect_options).state_machine_options.comment.set_by_user == true) {
    GetComment_abi_cxx11_(&local_d0,this);
    Value::Value(&local_1a8,&local_d0);
    ::std::__cxx11::string::string((string *)&local_1f0,"comment",(allocator *)&local_168);
    pmVar2 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)named_params,(key_type *)&local_1f0);
    Value::operator=(pmVar2,&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_1f0);
    Value::~Value(&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_d0);
  }
  if ((this->dialect_options).header.set_by_user == true) {
    Value::Value(&local_1a8,(this->dialect_options).header.value);
    ::std::__cxx11::string::string((string *)&local_1f0,"header",(allocator *)&local_168);
    pmVar2 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)named_params,(key_type *)&local_1f0);
    Value::operator=(pmVar2,&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_1f0);
    Value::~Value(&local_1a8);
  }
  if ((this->dialect_options).state_machine_options.strict_mode.set_by_user == true) {
    Value::Value(&local_1a8,(this->dialect_options).state_machine_options.strict_mode.value);
    ::std::__cxx11::string::string((string *)&local_1f0,"strict_mode",(allocator *)&local_168);
    pmVar2 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)named_params,(key_type *)&local_1f0);
    Value::operator=(pmVar2,&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_1f0);
    Value::~Value(&local_1a8);
  }
  value = NumericCastImpl<long,_unsigned_long,_false>::Convert((this->maximum_line_size).value);
  Value::BIGINT(&local_1a8,value);
  ::std::__cxx11::string::string((string *)&local_1f0,"max_line_size",(allocator *)&local_168);
  pmVar2 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)named_params,(key_type *)&local_1f0);
  Value::operator=(pmVar2,&local_1a8);
  ::std::__cxx11::string::~string((string *)&local_1f0);
  Value::~Value(&local_1a8);
  if ((this->dialect_options).skip_rows.set_by_user == true) {
    Value::UBIGINT(&local_1a8,(this->dialect_options).skip_rows.value);
    ::std::__cxx11::string::string((string *)&local_1f0,"skip",(allocator *)&local_168);
    pmVar2 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)named_params,(key_type *)&local_1f0);
    Value::operator=(pmVar2,&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_1f0);
    Value::~Value(&local_1a8);
  }
  Value::BOOLEAN(&local_1a8,this->null_padding);
  ::std::__cxx11::string::string((string *)&local_1f0,"null_padding",(allocator *)&local_168);
  pmVar2 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)named_params,(key_type *)&local_1f0);
  Value::operator=(pmVar2,&local_1a8);
  ::std::__cxx11::string::~string((string *)&local_1f0);
  Value::~Value(&local_1a8);
  Value::BOOLEAN(&local_1a8,this->parallel);
  ::std::__cxx11::string::string((string *)&local_1f0,"parallel",(allocator *)&local_168);
  pmVar2 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)named_params,(key_type *)&local_1f0);
  Value::operator=(pmVar2,&local_1a8);
  ::std::__cxx11::string::~string((string *)&local_1f0);
  Value::~Value(&local_1a8);
  this_00 = &(this->dialect_options).date_format;
  pmVar3 = ::std::
           map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
           ::at(this_00,&LogicalType::DATE);
  if ((pmVar3->value).super_StrTimeFormat.format_specifier._M_string_length != 0) {
    pmVar3 = ::std::
             map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
             ::at(this_00,&LogicalType::DATE);
    ::std::__cxx11::string::string
              ((string *)&local_f0,(string *)&(pmVar3->value).super_StrTimeFormat.format_specifier);
    Value::Value(&local_1a8,&local_f0);
    ::std::__cxx11::string::string((string *)&local_1f0,"dateformat",(allocator *)&local_168);
    pmVar2 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)named_params,(key_type *)&local_1f0);
    Value::operator=(pmVar2,&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_1f0);
    Value::~Value(&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_f0);
  }
  pmVar3 = ::std::
           map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
           ::at(this_00,&LogicalType::TIMESTAMP);
  if ((pmVar3->value).super_StrTimeFormat.format_specifier._M_string_length != 0) {
    pmVar3 = ::std::
             map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
             ::at(this_00,&LogicalType::TIMESTAMP);
    ::std::__cxx11::string::string
              ((string *)&local_110,(string *)&(pmVar3->value).super_StrTimeFormat.format_specifier)
    ;
    Value::Value(&local_1a8,&local_110);
    ::std::__cxx11::string::string((string *)&local_1f0,"timestampformat",(allocator *)&local_168);
    pmVar2 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)named_params,(key_type *)&local_1f0);
    Value::operator=(pmVar2,&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_1f0);
    Value::~Value(&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_110);
  }
  Value::BOOLEAN(&local_1a8,this->normalize_names);
  ::std::__cxx11::string::string((string *)&local_1f0,"normalize_names",(allocator *)&local_168);
  pmVar2 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)named_params,(key_type *)&local_1f0);
  Value::operator=(pmVar2,&local_1a8);
  ::std::__cxx11::string::~string((string *)&local_1f0);
  Value::~Value(&local_1a8);
  if ((this->name_list).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->name_list).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::__cxx11::string::string((string *)&local_1a8,"columns",(allocator *)&content);
    sVar4 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::count(&named_params->_M_h,(key_type *)&local_1a8);
    if (sVar4 == 0) {
      ::std::__cxx11::string::string((string *)&local_1f0,"column_names",(allocator *)&local_128);
      sVar4 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::count(&named_params->_M_h,(key_type *)&local_1f0);
      if (sVar4 == 0) {
        ::std::__cxx11::string::string((string *)&local_168,"names",&local_1a9);
        sVar4 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::count(&named_params->_M_h,&local_168);
        ::std::__cxx11::string::~string((string *)&local_168);
        ::std::__cxx11::string::~string((string *)&local_1f0);
        ::std::__cxx11::string::~string((string *)&local_1a8);
        if (sVar4 == 0) {
          content.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          content.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          content.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::reserve
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&content,
                     (long)(this->name_list).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->name_list).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5);
          pbVar1 = (this->name_list).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar5 = (this->name_list).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1;
              pbVar5 = pbVar5 + 1) {
            ::std::__cxx11::string::string((string *)&local_168,(string *)pbVar5);
            Value::Value(&local_1a8,&local_168);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
            emplace_back<duckdb::Value>
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&content,&local_1a8)
            ;
            Value::~Value(&local_1a8);
            ::std::__cxx11::string::~string((string *)&local_168);
          }
          LogicalType::LogicalType(&local_1a8.type_,VARCHAR);
          local_128.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start =
               content.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_128.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_finish =
               content.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_128.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               content.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          content.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          content.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          content.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          Value::LIST(&local_1f0,&local_1a8.type_,&local_128);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_128);
          LogicalType::~LogicalType(&local_1a8.type_);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&content);
          ::std::__cxx11::string::string
                    ((string *)&local_1a8,"column_names",(allocator *)&local_168);
          pmVar2 = ::std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)named_params,(key_type *)&local_1a8);
          Value::operator=(pmVar2,&local_1f0);
          ::std::__cxx11::string::~string((string *)&local_1a8);
          Value::~Value(&local_1f0);
        }
        goto LAB_009a48dd;
      }
      ::std::__cxx11::string::~string((string *)&local_1f0);
    }
    ::std::__cxx11::string::~string((string *)&local_1a8);
  }
LAB_009a48dd:
  Value::BOOLEAN(&local_1a8,this->all_varchar);
  ::std::__cxx11::string::string((string *)&local_1f0,"all_varchar",(allocator *)&local_168);
  pmVar2 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)named_params,(key_type *)&local_1f0);
  Value::operator=(pmVar2,&local_1a8);
  ::std::__cxx11::string::~string((string *)&local_1f0);
  Value::~Value(&local_1a8);
  return;
}

Assistant:

void CSVReaderOptions::ToNamedParameters(named_parameter_map_t &named_params) const {
	auto &delimiter = dialect_options.state_machine_options.delimiter;
	auto &quote = dialect_options.state_machine_options.quote;
	auto &escape = dialect_options.state_machine_options.escape;
	auto &comment = dialect_options.state_machine_options.comment;
	auto &strict_mode = dialect_options.state_machine_options.strict_mode;
	auto &header = dialect_options.header;
	if (delimiter.IsSetByUser()) {
		named_params["delim"] = Value(GetDelimiter());
	}
	if (dialect_options.state_machine_options.new_line.IsSetByUser()) {
		named_params["new_line"] = Value(GetNewline());
	}
	if (quote.IsSetByUser()) {
		named_params["quote"] = Value(GetQuote());
	}
	if (escape.IsSetByUser()) {
		named_params["escape"] = Value(GetEscape());
	}
	if (comment.IsSetByUser()) {
		named_params["comment"] = Value(GetComment());
	}
	if (header.IsSetByUser()) {
		named_params["header"] = Value(GetHeader());
	}
	if (strict_mode.IsSetByUser()) {
		named_params["strict_mode"] = Value(GetRFC4180());
	}
	named_params["max_line_size"] = Value::BIGINT(NumericCast<int64_t>(maximum_line_size.GetValue()));
	if (dialect_options.skip_rows.IsSetByUser()) {
		named_params["skip"] = Value::UBIGINT(GetSkipRows());
	}
	named_params["null_padding"] = Value::BOOLEAN(null_padding);
	named_params["parallel"] = Value::BOOLEAN(parallel);
	if (!dialect_options.date_format.at(LogicalType::DATE).GetValue().format_specifier.empty()) {
		named_params["dateformat"] =
		    Value(dialect_options.date_format.at(LogicalType::DATE).GetValue().format_specifier);
	}
	if (!dialect_options.date_format.at(LogicalType::TIMESTAMP).GetValue().format_specifier.empty()) {
		named_params["timestampformat"] =
		    Value(dialect_options.date_format.at(LogicalType::TIMESTAMP).GetValue().format_specifier);
	}

	named_params["normalize_names"] = Value::BOOLEAN(normalize_names);
	if (!name_list.empty() && !named_params.count("columns") && !named_params.count("column_names") &&
	    !named_params.count("names")) {
		named_params["column_names"] = StringVectorToValue(name_list);
	}
	named_params["all_varchar"] = Value::BOOLEAN(all_varchar);
}